

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

bool __thiscall
ON_Viewport::GetViewPlane(ON_Viewport *this,double view_plane_depth,ON_Plane *view_plane)

{
  double dVar1;
  bool bVar2;
  ON_3dVector OStack_58;
  ON_3dPoint local_40;
  
  if (this->m_bValidFrustum != true) {
    return false;
  }
  bVar2 = this->m_bValidCamera == true;
  if (bVar2) {
    ::operator*(&OStack_58,view_plane_depth,&this->m_CamZ);
    ON_3dPoint::operator-(&local_40,&this->m_CamLoc,&OStack_58);
    (view_plane->origin).z = local_40.z;
    (view_plane->origin).x = local_40.x;
    (view_plane->origin).y = local_40.y;
    (view_plane->xaxis).z = (this->m_CamX).z;
    dVar1 = (this->m_CamX).y;
    (view_plane->xaxis).x = (this->m_CamX).x;
    (view_plane->xaxis).y = dVar1;
    dVar1 = (this->m_CamY).y;
    (view_plane->yaxis).x = (this->m_CamY).x;
    (view_plane->yaxis).y = dVar1;
    (view_plane->yaxis).z = (this->m_CamY).z;
    dVar1 = (this->m_CamZ).y;
    (view_plane->zaxis).x = (this->m_CamZ).x;
    (view_plane->zaxis).y = dVar1;
    (view_plane->zaxis).z = (this->m_CamZ).z;
    ON_Plane::UpdateEquation(view_plane);
  }
  return bVar2;
}

Assistant:

bool ON_Viewport::GetViewPlane( 
  double view_plane_depth,
  ON_Plane& view_plane 
  ) const
{
  bool rc = IsValidFrustum() && IsValidCamera();
  if ( rc ) 
  {
    view_plane.origin = m_CamLoc - view_plane_depth*m_CamZ;
    view_plane.xaxis = m_CamX;
    view_plane.yaxis = m_CamY;
    view_plane.zaxis = m_CamZ;
    view_plane.UpdateEquation();
  }
  return rc;
}